

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power,ImGuiSliderFlags flags)

{
  double v_max_00;
  int iVar1;
  long v_min_00;
  ImGuiContext *pIVar2;
  uint uVar3;
  uint uVar4;
  ImU32 IVar5;
  int iVar6;
  int iVar7;
  ImVec2 *pIVar8;
  ulong uVar9;
  unsigned_long_long uVar10;
  longlong lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ImRect *pIVar15;
  uint extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  int extraout_EDX_02;
  ulong uVar16;
  ImGuiWindow *pIVar17;
  uint uVar18;
  ImGuiDataType IVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ImGuiCol IVar23;
  int iVar24;
  ImGuiContext *g_1;
  ImGuiContext *g_3;
  uint uVar25;
  ImGuiContext *g;
  ImDrawList *this;
  bool bVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  double dVar34;
  ImVec2 IVar35;
  double dVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  void *local_c8;
  undefined8 uStack_c0;
  float local_a8;
  undefined1 auStack_a4 [12];
  float local_68;
  undefined1 auStack_64 [12];
  ImVec2 local_50;
  ImVec2 local_48;
  double local_40;
  double local_38;
  
  pIVar2 = GImGui;
  if (5 < (uint)data_type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x2362,
                  "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                 );
  }
  uStack_c0 = local_c8;
  local_c8 = v;
  switch(data_type) {
  case 0:
    iVar1 = *v_min;
    if ((iVar1 < -0x40000000) || (iVar21 = *v_max, 0x3fffffff < iVar21)) {
      __assert_fail("*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x234f,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar17 = GImGui->CurrentWindow;
    pIVar17->WriteAccessed = true;
    if (pIVar2->ActiveId == id) {
      IVar23 = 9;
    }
    else {
      IVar23 = (pIVar2->HoveredId == id) + 7;
    }
    IVar5 = GetColorU32(IVar23,1.0);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar5,true,(pIVar2->Style).FrameRounding);
    uVar25 = flags & 1;
    pIVar8 = (ImVec2 *)&(bb->Max).y;
    if (uVar25 == 0) {
      pIVar8 = &bb->Max;
    }
    fVar37 = pIVar8->x;
    fVar39 = (&(bb->Min).x)[uVar25];
    fVar40 = (fVar37 - fVar39) + -4.0;
    iVar24 = iVar21 - iVar1;
    uVar4 = iVar1 - iVar21;
    uVar28 = -uVar4;
    if (0 < (int)uVar4) {
      uVar28 = uVar4;
    }
    fVar38 = (pIVar2->Style).GrabMinSize;
    fVar42 = fVar40 / (float)(int)(uVar28 + 1);
    uVar4 = -(uint)(fVar38 <= fVar42);
    fVar38 = (float)(~uVar4 & (uint)fVar38 | (uint)fVar42 & uVar4);
    if (fVar40 <= fVar38) {
      fVar38 = fVar40;
    }
    fVar39 = fVar39 + 2.0 + fVar38 * 0.5;
    if (pIVar2->ActiveId == id) {
      if (pIVar2->ActiveIdSource != ImGuiInputSource_Nav) {
        if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
          if ((pIVar2->IO).MouseDown[0] != false) {
            fVar42 = 0.0;
            if (0.0 < fVar40 - fVar38) {
              fVar40 = (*(float *)((pIVar2->IO).MouseDown + (ulong)uVar25 * 4 + -8) - fVar39) /
                       (fVar40 - fVar38);
              fVar42 = 1.0;
              if (fVar40 <= 1.0) {
                fVar42 = fVar40;
              }
              fVar42 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar42);
            }
            iVar7 = extraout_EDX_00;
            if (uVar25 != 0) {
              fVar42 = 1.0 - fVar42;
            }
LAB_00182b46:
            iVar6 = (int)((float)iVar24 * fVar42);
            iVar20 = (int)((float)iVar24 * fVar42 + 0.5);
            if (iVar20 < iVar6) {
              iVar20 = iVar6;
            }
            iVar7 = RoundScalarWithFormat<int,int>(format,iVar20 + iVar1,iVar7);
            bVar26 = *v != iVar7;
            if (bVar26) {
              *(int *)v = iVar7;
            }
            goto LAB_00182baa;
          }
          ClearActiveID();
        }
        goto LAB_001822d3;
      }
      IVar35 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar40 = IVar35.x;
      if (uVar25 != 0) {
        fVar40 = -IVar35.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
LAB_001823eb:
        bVar26 = false;
      }
      else {
        fVar41 = 0.0;
        if ((fVar40 == 0.0) && (!NAN(fVar40))) goto LAB_001823eb;
        iVar7 = extraout_EDX_02;
        if (iVar1 != iVar21) {
          iVar20 = iVar21;
          if (iVar1 < iVar21) {
            iVar20 = iVar1;
          }
          iVar6 = iVar21;
          if (iVar21 < iVar1) {
            iVar6 = iVar1;
          }
          iVar7 = *v;
          if (iVar7 < iVar6) {
            iVar6 = iVar7;
          }
          if (iVar7 < iVar20) {
            iVar6 = iVar20;
          }
          fVar41 = (float)(iVar6 - iVar1) / (float)iVar24;
        }
        if ((uVar28 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          iVar7 = 0x1cbd28;
          fVar40 = *(float *)(&DAT_001cbd28 + (ulong)(fVar40 < 0.0) * 4) / (float)(int)uVar28;
        }
        else {
          fVar40 = fVar40 / 100.0;
        }
        uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar40 = (float)(~uVar28 & (uint)fVar40 | (uint)(fVar40 * 10.0) & uVar28);
        if (((fVar41 < 1.0) || (fVar40 <= 0.0)) && ((0.0 < fVar41 || (0.0 <= fVar40)))) {
          fVar41 = fVar41 + fVar40;
          fVar42 = 1.0;
          if (fVar41 <= 1.0) {
            fVar42 = fVar41;
          }
          fVar42 = (float)(~-(uint)(fVar41 < 0.0) & (uint)fVar42);
          goto LAB_00182b46;
        }
        bVar26 = false;
      }
    }
    else {
LAB_001822d3:
      bVar26 = false;
    }
LAB_00182baa:
    fVar40 = 0.0;
    if (iVar1 != iVar21) {
      iVar7 = iVar21;
      if (iVar1 < iVar21) {
        iVar7 = iVar1;
      }
      if (iVar21 < iVar1) {
        iVar21 = iVar1;
      }
      iVar20 = *v;
      if (iVar20 < iVar21) {
        iVar21 = iVar20;
      }
      if (iVar20 < iVar7) {
        iVar21 = iVar7;
      }
      fVar40 = (float)(iVar21 - iVar1) / (float)iVar24;
    }
    if (uVar25 != 0) {
      fVar40 = 1.0 - fVar40;
    }
    fVar39 = (((fVar37 + -2.0) - fVar38 * 0.5) - fVar39) * fVar40 + fVar39;
    if (uVar25 != 0) {
      local_50.x = (bb->Min).x + 2.0;
      local_48.x = (bb->Max).x + -2.0;
      local_50.y = -fVar38 * 0.5 + fVar39;
      local_48.y = fVar38 * 0.5 + fVar39;
    }
    else {
      local_50.x = -fVar38 * 0.5 + fVar39;
      local_48.x = fVar38 * 0.5 + fVar39;
      local_50.y = (bb->Min).y + 2.0;
      local_48.y = (bb->Max).y + -2.0;
    }
    this = pIVar17->DrawList;
    IVar5 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
    fVar37 = (pIVar2->Style).GrabRounding;
    goto LAB_00182f38;
  case 1:
    uVar25 = *v_min;
    if ((int)uVar25 < 0) {
      __assert_fail("*(const ImU32*)v_min <= IM_U32_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2352,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    uVar28 = *v_max;
    pIVar17 = GImGui->CurrentWindow;
    pIVar17->WriteAccessed = true;
    if (pIVar2->ActiveId == id) {
      IVar23 = 9;
    }
    else {
      IVar23 = (pIVar2->HoveredId == id) + 7;
    }
    uVar18 = -(uVar25 - uVar28);
    uVar4 = uVar25 - uVar28;
    if (uVar25 < uVar28) {
      uVar4 = uVar18;
    }
    IVar5 = GetColorU32(IVar23,1.0);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar5,true,(pIVar2->Style).FrameRounding);
    uVar12 = flags & 1;
    pIVar8 = (ImVec2 *)&(bb->Max).y;
    if (uVar12 == 0) {
      pIVar8 = &bb->Max;
    }
    fVar37 = pIVar8->x;
    fVar40 = (fVar37 - (&(bb->Min).x)[uVar12]) + -4.0;
    fVar39 = (pIVar2->Style).GrabMinSize;
    if (-1 < (int)uVar4) {
      fVar38 = fVar40 / (float)(int)(uVar4 + 1);
      uVar27 = -(uint)(fVar39 <= fVar38);
      fVar39 = (float)(~uVar27 & (uint)fVar39 | (uint)fVar38 & uVar27);
    }
    if (fVar40 <= fVar39) {
      fVar39 = fVar40;
    }
    pIVar15 = (ImRect *)&(bb->Min).y;
    if (uVar12 == 0) {
      pIVar15 = bb;
    }
    fVar38 = (pIVar15->Min).x + 2.0 + fVar39 * 0.5;
    if (pIVar2->ActiveId == id) {
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar35 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        fVar40 = IVar35.x;
        if (uVar12 != 0) {
          fVar40 = -IVar35.y;
        }
        if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
          ClearActiveID();
        }
        else {
          fVar42 = 0.0;
          if ((fVar40 != 0.0) || (NAN(fVar40))) {
            uVar27 = extraout_EDX_01;
            if (uVar28 != uVar25) {
              uVar3 = uVar28;
              if (uVar28 >= uVar25 && uVar28 != uVar25) {
                uVar3 = uVar25;
              }
              uVar13 = uVar28;
              if (uVar28 < uVar25) {
                uVar13 = uVar25;
              }
              uVar27 = *v;
              if (uVar27 < uVar13) {
                uVar13 = uVar27;
              }
              if (uVar27 < uVar3) {
                uVar13 = uVar3;
              }
              fVar42 = (float)(uVar13 - uVar25) / (float)uVar18;
            }
            if ((uVar4 + 100 < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              uVar27 = 0x1cbd28;
              fVar40 = *(float *)(&DAT_001cbd28 + (ulong)(fVar40 < 0.0) * 4) / (float)(int)uVar4;
            }
            else {
              fVar40 = fVar40 / 100.0;
            }
            uVar4 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar40 = (float)(~uVar4 & (uint)fVar40 | (uint)(fVar40 * 10.0) & uVar4);
            if (((fVar42 < 1.0) || (fVar40 <= 0.0)) && ((0.0 < fVar42 || (0.0 <= fVar40)))) {
              fVar42 = fVar42 + fVar40;
              fVar41 = 1.0;
              if (fVar42 <= 1.0) {
                fVar41 = fVar42;
              }
              fVar41 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar41);
              goto LAB_0018126c;
            }
            bVar26 = false;
            goto LAB_00182686;
          }
        }
        bVar26 = false;
      }
      else if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar2->IO).MouseDown[0] == false) {
          ClearActiveID();
          bVar26 = false;
        }
        else {
          fVar41 = 0.0;
          if (0.0 < fVar40 - fVar39) {
            fVar40 = (*(float *)((pIVar2->IO).MouseDown + (ulong)uVar12 * 4 + -8) - fVar38) /
                     (fVar40 - fVar39);
            fVar41 = 1.0;
            if (fVar40 <= 1.0) {
              fVar41 = fVar40;
            }
            fVar41 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar41);
          }
          uVar27 = extraout_EDX;
          if (uVar12 != 0) {
            fVar41 = 1.0 - fVar41;
          }
LAB_0018126c:
          uVar3 = (uint)(long)((float)uVar18 * fVar41);
          uVar4 = (uint)(long)((float)uVar18 * fVar41 + 0.5);
          if (uVar4 < uVar3) {
            uVar4 = uVar3;
          }
          uVar4 = RoundScalarWithFormat<unsigned_int,int>(format,uVar4 + uVar25,uVar27);
          bVar26 = *v != uVar4;
          if (bVar26) {
            *(uint *)v = uVar4;
          }
        }
      }
      else {
        bVar26 = false;
      }
    }
    else {
      bVar26 = false;
    }
LAB_00182686:
    fVar40 = 0.0;
    if (uVar28 != uVar25) {
      uVar4 = uVar28;
      if (uVar28 >= uVar25 && uVar28 != uVar25) {
        uVar4 = uVar25;
      }
      if (uVar28 < uVar25) {
        uVar28 = uVar25;
      }
      uVar27 = *v;
      if (uVar27 < uVar28) {
        uVar28 = uVar27;
      }
      if (uVar27 < uVar4) {
        uVar28 = uVar4;
      }
      fVar40 = (float)(uVar28 - uVar25) / (float)uVar18;
    }
    if (uVar12 != 0) {
      fVar40 = 1.0 - fVar40;
    }
    fVar38 = (((fVar37 + -2.0) - fVar39 * 0.5) - fVar38) * fVar40 + fVar38;
    if (uVar12 != 0) {
      local_50.x = (bb->Min).x + 2.0;
      local_48.x = (bb->Max).x + -2.0;
      local_50.y = -fVar39 * 0.5 + fVar38;
      local_48.y = fVar39 * 0.5 + fVar38;
    }
    else {
      local_50.x = -fVar39 * 0.5 + fVar38;
      local_48.x = fVar39 * 0.5 + fVar38;
      local_50.y = (bb->Min).y + 2.0;
      local_48.y = (bb->Max).y + -2.0;
    }
    this = pIVar17->DrawList;
    IVar5 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
    fVar37 = (pIVar2->Style).GrabRounding;
    goto LAB_00182f38;
  case 2:
    uVar29 = *v_min;
    if (((long)uVar29 < -0x4000000000000000) || (v_min_00 = *v_max, 0x3fffffffffffffff < v_min_00))
    {
      __assert_fail("*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2355,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar17 = GImGui->CurrentWindow;
    pIVar17->WriteAccessed = true;
    if (pIVar2->ActiveId == id) {
      IVar23 = 9;
    }
    else {
      IVar23 = (pIVar2->HoveredId == id) + 7;
    }
    uVar14 = uVar29;
    IVar5 = GetColorU32(IVar23,1.0);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar5,true,(pIVar2->Style).FrameRounding);
    uVar25 = flags & 1;
    pIVar8 = (ImVec2 *)&(bb->Max).y;
    if (uVar25 == 0) {
      pIVar8 = &bb->Max;
    }
    fVar37 = pIVar8->x;
    fVar39 = (&(bb->Min).x)[uVar25];
    fVar40 = (fVar37 - fVar39) + -4.0;
    uVar16 = uVar29 - v_min_00;
    uVar9 = -uVar16;
    if (0 < (long)uVar16) {
      uVar9 = uVar16;
    }
    fVar38 = (pIVar2->Style).GrabMinSize;
    fVar42 = fVar40 / (float)(long)(uVar9 + 1);
    uVar28 = -(uint)(fVar38 <= fVar42);
    fVar38 = (float)(~uVar28 & (uint)fVar38 | (uint)fVar42 & uVar28);
    if (fVar40 <= fVar38) {
      fVar38 = fVar40;
    }
    fVar42 = fVar38 * 0.5;
    fVar39 = fVar39 + 2.0 + fVar42;
    if (pIVar2->ActiveId == id) {
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
        fVar40 = 0.0;
        IVar35 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        fVar41 = IVar35.x;
        if (uVar25 != 0) {
          fVar41 = -IVar35.y;
        }
        if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
          ClearActiveID();
        }
        else {
          fVar40 = 0.0;
          if ((fVar41 != 0.0) || (NAN(fVar41))) {
            fVar32 = SliderBehaviorCalcRatioFromValue<long_long,double>
                               ((ImGuiDataType)*v,uVar29,v_min_00,uVar14,fVar41,0.0);
            if ((uVar9 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              uVar14 = (ulong)(fVar41 < 0.0);
              fVar41 = *(float *)(&DAT_001cbd28 + uVar14 * 4) / (float)(long)uVar9;
            }
            else {
              fVar41 = fVar41 / 100.0;
            }
            uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar40 = (float)(~uVar28 & (uint)fVar41 | (uint)(fVar41 * 10.0) & uVar28);
            if (((fVar32 < 1.0) || (fVar40 <= 0.0)) && ((0.0 < fVar32 || (0.0 <= fVar40)))) {
              fVar32 = fVar32 + fVar40;
              fVar41 = 1.0;
              if (fVar32 <= 1.0) {
                fVar41 = fVar32;
              }
              fVar41 = (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar41);
              goto LAB_0018298b;
            }
            goto LAB_0018296e;
          }
        }
        bVar26 = false;
      }
      else {
        if (pIVar2->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_001817e8;
        if ((pIVar2->IO).MouseDown[0] == false) {
          ClearActiveID();
LAB_0018296e:
          bVar26 = false;
        }
        else {
          fVar41 = 0.0;
          if (0.0 < fVar40 - fVar38) {
            fVar40 = (*(float *)((pIVar2->IO).MouseDown + (ulong)uVar25 * 4 + -8) - fVar39) /
                     (fVar40 - fVar38);
            fVar41 = 1.0;
            if (fVar40 <= 1.0) {
              fVar41 = fVar40;
            }
            fVar41 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar41);
          }
          if (uVar25 != 0) {
            fVar41 = 1.0 - fVar41;
          }
LAB_0018298b:
          fVar40 = (float)(long)(v_min_00 - uVar29) * fVar41;
          lVar22 = (long)(fVar40 + 0.5);
          if ((long)(fVar40 + 0.5) < (long)fVar40) {
            lVar22 = (long)fVar40;
          }
          lVar11 = RoundScalarWithFormat<long_long,long_long>
                             (format,(int)lVar22 + (int)uVar29,v_min_00);
          bVar26 = *v != lVar11;
          if (bVar26) {
            *(longlong *)v = lVar11;
          }
        }
      }
    }
    else {
LAB_001817e8:
      bVar26 = false;
    }
    fVar40 = SliderBehaviorCalcRatioFromValue<long_long,double>
                       ((ImGuiDataType)*v,uVar29,v_min_00,uVar14,fVar42,fVar40);
    if (uVar25 != 0) {
      fVar40 = 1.0 - fVar40;
    }
    fVar39 = (((fVar37 + -2.0) - fVar42) - fVar39) * fVar40 + fVar39;
    if (uVar25 != 0) {
      local_50.x = (bb->Min).x + 2.0;
      local_48.x = (bb->Max).x + -2.0;
      local_50.y = -fVar38 * 0.5 + fVar39;
      local_48.y = fVar38 * 0.5 + fVar39;
    }
    else {
      local_50.x = -fVar38 * 0.5 + fVar39;
      local_48.x = fVar38 * 0.5 + fVar39;
      local_50.y = (bb->Min).y + 2.0;
      local_48.y = (bb->Max).y + -2.0;
    }
    goto LAB_00182ac4;
  case 3:
    uVar29 = *v_min;
    if ((long)uVar29 < 0) {
      __assert_fail("*(const ImU64*)v_min <= IM_U64_MAX/2",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2358,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    uVar14 = *v_max;
    pIVar17 = GImGui->CurrentWindow;
    pIVar17->WriteAccessed = true;
    if (pIVar2->ActiveId == id) {
      IVar23 = 9;
    }
    else {
      IVar23 = (pIVar2->HoveredId == id) + 7;
    }
    uVar9 = uVar29 - uVar14;
    if (uVar29 < uVar14) {
      uVar9 = -(uVar29 - uVar14);
    }
    IVar5 = GetColorU32(IVar23,1.0);
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar5,true,(pIVar2->Style).FrameRounding);
    uVar25 = flags & 1;
    pIVar8 = (ImVec2 *)&(bb->Max).y;
    if (uVar25 == 0) {
      pIVar8 = &bb->Max;
    }
    fVar37 = pIVar8->x;
    fVar40 = (fVar37 - (&(bb->Min).x)[uVar25]) + -4.0;
    fVar39 = (pIVar2->Style).GrabMinSize;
    if (-1 < (long)uVar9) {
      fVar38 = fVar40 / (float)(long)(uVar9 + 1);
      uVar28 = -(uint)(fVar39 <= fVar38);
      fVar39 = (float)(~uVar28 & (uint)fVar39 | (uint)fVar38 & uVar28);
    }
    pIVar15 = (ImRect *)&(bb->Min).y;
    if (uVar25 == 0) {
      pIVar15 = bb;
    }
    if (fVar40 <= fVar39) {
      fVar39 = fVar40;
    }
    fVar38 = fVar39 * 0.5;
    fVar42 = (pIVar15->Min).x + 2.0 + fVar38;
    pIVar15 = bb;
    if (pIVar2->ActiveId == id) {
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
        fVar40 = 0.0;
        IVar35 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        fVar41 = IVar35.x;
        if (uVar25 != 0) {
          fVar41 = -IVar35.y;
        }
        if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
          ClearActiveID();
          bVar26 = false;
        }
        else {
          fVar40 = 0.0;
          if ((fVar41 != 0.0) || (NAN(fVar41))) {
            fVar32 = SliderBehaviorCalcRatioFromValue<unsigned_long_long,double>
                               ((ImGuiDataType)*v,uVar29,uVar14,(unsigned_long_long)pIVar15,fVar41,
                                0.0);
            pIVar15 = (ImRect *)(uVar9 + 100);
            if ((pIVar15 < (ImRect *)0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
              pIVar15 = (ImRect *)(ulong)(fVar41 < 0.0);
              fVar41 = *(float *)(&DAT_001cbd28 + (long)pIVar15 * 4) / (float)(long)uVar9;
            }
            else {
              fVar41 = fVar41 / 100.0;
            }
            uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
            fVar40 = (float)(~uVar28 & (uint)fVar41 | (uint)(fVar41 * 10.0) & uVar28);
            if (((fVar32 < 1.0) || (fVar40 <= 0.0)) && ((0.0 < fVar32 || (0.0 <= fVar40)))) {
              fVar32 = fVar32 + fVar40;
              fVar41 = 1.0;
              if (fVar32 <= 1.0) {
                fVar41 = fVar32;
              }
              fVar41 = (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar41);
              goto LAB_00182487;
            }
            goto LAB_00182467;
          }
          bVar26 = false;
        }
      }
      else {
        if (pIVar2->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_001810a5;
        if ((pIVar2->IO).MouseDown[0] == false) {
          ClearActiveID();
LAB_00182467:
          bVar26 = false;
        }
        else {
          fVar41 = 0.0;
          if (0.0 < fVar40 - fVar39) {
            fVar40 = (*(float *)((pIVar2->IO).MouseDown + (ulong)uVar25 * 4 + -8) - fVar42) /
                     (fVar40 - fVar39);
            fVar41 = 1.0;
            if (fVar40 <= 1.0) {
              fVar41 = fVar40;
            }
            fVar41 = (float)(~-(uint)(fVar40 < 0.0) & (uint)fVar41);
          }
          if (uVar25 != 0) {
            fVar41 = 1.0 - fVar41;
          }
LAB_00182487:
          fVar41 = fVar41 * (float)-(uVar29 - uVar14);
          uVar16 = (long)(fVar41 - 9.223372e+18) & (long)fVar41 >> 0x3f | (long)fVar41;
          uVar9 = (ulong)((double)fVar41 + 0.5);
          dVar36 = ((double)fVar41 + 0.5) - 9.223372036854776e+18;
          fVar40 = SUB84(dVar36,0);
          pIVar15 = (ImRect *)((long)uVar9 >> 0x3f);
          uVar9 = (long)dVar36 & (ulong)pIVar15 | uVar9;
          if (uVar9 < uVar16) {
            uVar9 = uVar16;
          }
          uVar10 = RoundScalarWithFormat<unsigned_long_long,long_long>
                             (format,(int)uVar9 + (int)uVar29,uVar16);
          if (*v == uVar10) {
            bVar26 = false;
          }
          else {
            *(unsigned_long_long *)v = uVar10;
            bVar26 = true;
          }
        }
      }
    }
    else {
LAB_001810a5:
      bVar26 = false;
    }
    fVar40 = SliderBehaviorCalcRatioFromValue<unsigned_long_long,double>
                       ((ImGuiDataType)*v,uVar29,uVar14,(unsigned_long_long)pIVar15,fVar38,fVar40);
    if (uVar25 != 0) {
      fVar40 = 1.0 - fVar40;
    }
    fVar42 = (((fVar37 + -2.0) - fVar38) - fVar42) * fVar40 + fVar42;
    if (uVar25 != 0) {
      local_50.x = (bb->Min).x + 2.0;
      local_48.x = (bb->Max).x + -2.0;
      local_50.y = -fVar39 * 0.5 + fVar42;
      local_48.y = fVar39 * 0.5 + fVar42;
    }
    else {
      local_50.x = -fVar39 * 0.5 + fVar42;
      local_48.x = fVar39 * 0.5 + fVar42;
      local_50.y = (bb->Min).y + 2.0;
      local_48.y = (bb->Max).y + -2.0;
    }
LAB_00182ac4:
    this = pIVar17->DrawList;
    break;
  case 4:
    fVar37 = *v_min;
    if ((fVar37 < -1.7014117e+38) || (fVar39 = *v_max, 1.7014117e+38 < fVar39)) {
      __assert_fail("*(const float*)v_min >= -3.40282347e+38F/2.0f && *(const float*)v_max <= 3.40282347e+38F/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235b,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar17 = GImGui->CurrentWindow;
    pIVar17->WriteAccessed = true;
    if (pIVar2->ActiveId == id) {
      IVar23 = 9;
    }
    else {
      IVar23 = (pIVar2->HoveredId == id) + 7;
    }
    IVar5 = GetColorU32(IVar23,1.0);
    IVar19 = 1;
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar5,true,(pIVar2->Style).FrameRounding);
    uVar25 = flags & 1;
    pIVar8 = (ImVec2 *)&(bb->Max).y;
    if (uVar25 == 0) {
      pIVar8 = &bb->Max;
    }
    fVar40 = pIVar8->x;
    fVar38 = (&(bb->Min).x)[uVar25];
    fVar41 = (fVar40 - fVar38) + -4.0;
    fVar42 = (pIVar2->Style).GrabMinSize;
    if (fVar41 <= fVar42) {
      fVar42 = fVar41;
    }
    fVar32 = fVar42 * 0.5;
    if (((power == 1.0) && (!NAN(power))) || (0.0 <= fVar37 * fVar39)) {
      fVar31 = (float)(-(uint)(fVar37 < 0.0) & 0x3f800000);
    }
    else {
      uVar28 = -(uint)(-fVar37 <= fVar37);
      local_40 = (double)CONCAT44(local_40._4_4_,1.0 / power);
      local_68 = fVar32;
      local_38 = (double)CONCAT44(local_38._4_4_,fVar41);
      fVar31 = powf((float)(uVar28 & (uint)fVar37 | ~uVar28 & (uint)-fVar37),1.0 / power);
      uVar28 = -(uint)(-fVar39 <= fVar39);
      fVar41 = powf((float)(uVar28 & (uint)fVar39 | ~uVar28 & (uint)-fVar39),local_40._0_4_);
      fVar31 = fVar31 / (fVar41 + fVar31);
      fVar41 = local_38._0_4_;
    }
    fVar38 = fVar38 + 2.0 + fVar32;
    local_68 = fVar32;
    if (pIVar2->ActiveId == id) {
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar19 = 5;
        IVar5 = 3;
        IVar35 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
        fVar41 = IVar35.x;
        if (uVar25 != 0) {
          fVar41 = -IVar35.y;
        }
        if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
          ClearActiveID();
        }
        else if ((fVar41 != 0.0) || (NAN(fVar41))) {
          fVar33 = SliderBehaviorCalcRatioFromValue<float,float>
                             (IVar5,*v,fVar37,fVar39,power,fVar31);
          uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xe]);
          fVar41 = (float)(~uVar28 & (uint)(fVar41 / 100.0) |
                          (uint)((fVar41 / 100.0) / 10.0) & uVar28);
          uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
          fVar41 = (float)(uVar28 & (uint)(fVar41 * 10.0) | ~uVar28 & (uint)fVar41);
          if ((fVar33 < 1.0) || (fVar41 <= 0.0)) {
            if ((fVar33 <= 0.0) && (fVar41 < 0.0)) goto LAB_0018228c;
            fVar33 = fVar33 + fVar41;
            fVar30 = 1.0;
            if (fVar33 <= 1.0) {
              fVar30 = fVar33;
            }
            fVar30 = (float)(~-(uint)(fVar33 < 0.0) & (uint)fVar30);
            goto LAB_001827fd;
          }
LAB_001828f2:
          bVar26 = false;
          goto LAB_00181546;
        }
        bVar26 = false;
      }
      else {
        if (pIVar2->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00181543;
        if ((pIVar2->IO).MouseDown[0] == false) {
          ClearActiveID();
LAB_0018228c:
          bVar26 = false;
        }
        else {
          fVar30 = 0.0;
          if (0.0 < fVar41 - fVar42) {
            fVar41 = (*(float *)((pIVar2->IO).MouseDown + (ulong)uVar25 * 4 + -8) - fVar38) /
                     (fVar41 - fVar42);
            fVar30 = 1.0;
            if (fVar41 <= 1.0) {
              fVar30 = fVar41;
            }
            fVar30 = (float)(~-(uint)(fVar41 < 0.0) & (uint)fVar30);
          }
          if (uVar25 != 0) {
            fVar30 = 1.0 - fVar30;
          }
LAB_001827fd:
          if ((power != 1.0) || (NAN(power))) {
            if (fVar31 <= fVar30) {
              uVar28 = -(uint)(1e-06 < ABS(fVar31 + -1.0));
              fVar33 = powf((float)(~uVar28 & (uint)fVar30 |
                                   (uint)((fVar30 - fVar31) / (1.0 - fVar31)) & uVar28),power);
              fVar41 = (float)(-(uint)(0.0 <= fVar37) & (uint)fVar37);
              fVar32 = fVar39;
            }
            else {
              fVar33 = powf(1.0 - fVar30 / fVar31,power);
              fVar41 = fVar39;
              fVar32 = fVar37;
              if (0.0 <= fVar39) {
                fVar41 = 0.0;
              }
            }
            fVar41 = (fVar32 - fVar41) * fVar33 + fVar41;
          }
          else {
            fVar41 = (fVar39 - fVar37) * fVar30 + fVar37;
          }
          fVar41 = RoundScalarWithFormat<float,float>(format,IVar19,fVar41);
          IVar5 = (ImU32)format;
          if ((*v == fVar41) && (!NAN(*v) && !NAN(fVar41))) goto LAB_001828f2;
          *(float *)v = fVar41;
          bVar26 = true;
        }
      }
    }
    else {
LAB_00181543:
      bVar26 = false;
    }
LAB_00181546:
    fVar37 = SliderBehaviorCalcRatioFromValue<float,float>(IVar5,*v,fVar37,fVar39,power,fVar31);
    if (uVar25 != 0) {
      fVar37 = 1.0 - fVar37;
    }
    fVar38 = (((fVar40 + -2.0) - local_68) - fVar38) * fVar37 + fVar38;
    if (uVar25 != 0) {
      local_50.x = (bb->Min).x + 2.0;
      local_48.x = (bb->Max).x + -2.0;
      local_50.y = -fVar42 * 0.5 + fVar38;
      local_48.y = fVar42 * 0.5 + fVar38;
    }
    else {
      local_50.x = -fVar42 * 0.5 + fVar38;
      local_48.x = fVar42 * 0.5 + fVar38;
      local_50.y = (bb->Min).y + 2.0;
      local_48.y = (bb->Max).y + -2.0;
    }
    this = pIVar17->DrawList;
    break;
  case 5:
    dVar36 = *v_min;
    if ((dVar36 < -8.988465674311579e+307) || (v_max_00 = *v_max, 8.988465674311579e+307 < v_max_00)
       ) {
      __assert_fail("*(const double*)v_min >= -1.7976931348623157e+308/2.0f && *(const double*)v_max <= 1.7976931348623157e+308/2.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x235e,
                    "bool ImGui::SliderBehavior(const ImRect &, ImGuiID, ImGuiDataType, void *, const void *, const void *, const char *, float, ImGuiSliderFlags)"
                   );
    }
    pIVar17 = GImGui->CurrentWindow;
    pIVar17->WriteAccessed = true;
    if (pIVar2->ActiveId == id) {
      IVar23 = 9;
    }
    else {
      IVar23 = (pIVar2->HoveredId == id) + 7;
    }
    IVar5 = GetColorU32(IVar23,1.0);
    IVar19 = 1;
    RenderNavHighlight(bb,id,1);
    RenderFrame(bb->Min,bb->Max,IVar5,true,(pIVar2->Style).FrameRounding);
    fVar37 = 1.0;
    uVar25 = flags & 1;
    pIVar8 = (ImVec2 *)&(bb->Max).y;
    if (uVar25 == 0) {
      pIVar8 = &bb->Max;
    }
    fVar39 = pIVar8->x;
    fVar40 = (&(bb->Min).x)[uVar25];
    fVar42 = (fVar39 - fVar40) + -4.0;
    fVar38 = (pIVar2->Style).GrabMinSize;
    if (fVar42 <= fVar38) {
      fVar38 = fVar42;
    }
    fVar41 = fVar38 * 0.5;
    if (((power == 1.0) && (!NAN(power))) || (0.0 <= dVar36 * v_max_00)) {
      if (0.0 <= dVar36) {
        fVar37 = 0.0;
      }
    }
    else {
      uVar29 = -(ulong)(-dVar36 <= dVar36);
      local_40 = 1.0 / (double)power;
      local_a8 = fVar41;
      local_38 = pow((double)(uVar29 & (ulong)dVar36 | ~uVar29 & (ulong)-dVar36),local_40);
      uVar29 = -(ulong)(-v_max_00 <= v_max_00);
      dVar34 = pow((double)(uVar29 & (ulong)v_max_00 | ~uVar29 & (ulong)-v_max_00),local_40);
      fVar37 = (float)(local_38 / (dVar34 + local_38));
    }
    fVar40 = fVar40 + 2.0 + fVar41;
    if (pIVar2->ActiveId != id) {
      bVar26 = false;
      goto LAB_00182e12;
    }
    local_c8._0_4_ = fVar37;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      local_a8 = fVar41;
      IVar19 = 5;
      IVar5 = 3;
      IVar35 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar42 = IVar35.x;
      if (uVar25 != 0) {
        fVar42 = -IVar35.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar42 != 0.0) || (NAN(fVar42))) {
        fVar32 = SliderBehaviorCalcRatioFromValue<double,double>
                           (IVar5,*v,dVar36,v_max_00,power,fVar37);
        uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xe]);
        fVar42 = (float)(~uVar28 & (uint)(fVar42 / 100.0) | (uint)((fVar42 / 100.0) / 10.0) & uVar28
                        );
        uVar28 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar42 = (float)(uVar28 & (uint)(fVar42 * 10.0) | ~uVar28 & (uint)fVar42);
        if ((fVar32 < 1.0) || (fVar42 <= 0.0)) {
          if ((0.0 < fVar32) || (0.0 <= fVar42)) {
            fVar32 = fVar32 + fVar42;
            fVar31 = 1.0;
            if (fVar32 <= 1.0) {
              fVar31 = fVar32;
            }
            fVar31 = (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar31);
            goto LAB_00182cfb;
          }
          goto LAB_00182309;
        }
LAB_00182df1:
        bVar26 = false;
        goto LAB_00182e0b;
      }
      bVar26 = false;
LAB_00182e0b:
      fVar41 = local_a8;
      fVar37 = local_c8._0_4_;
    }
    else if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] != false) {
        fVar31 = 0.0;
        if (0.0 < fVar42 - fVar38) {
          fVar42 = (*(float *)((pIVar2->IO).MouseDown + (ulong)uVar25 * 4 + -8) - fVar40) /
                   (fVar42 - fVar38);
          fVar31 = 1.0;
          if (fVar42 <= 1.0) {
            fVar31 = fVar42;
          }
          fVar31 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar31);
        }
        if (uVar25 != 0) {
          fVar31 = 1.0 - fVar31;
        }
LAB_00182cfb:
        local_a8 = fVar41;
        if ((power != 1.0) || (dVar34 = dVar36, NAN(power))) {
          if (fVar37 <= fVar31) {
            uVar28 = -(uint)(1e-06 < ABS(fVar37 + -1.0));
            fVar31 = powf((float)(~uVar28 & (uint)fVar31 |
                                 (uint)((fVar31 - fVar37) / (1.0 - fVar37)) & uVar28),power);
            dVar34 = (double)(-(ulong)(0.0 <= dVar36) & (ulong)dVar36);
            goto LAB_00182db9;
          }
          fVar37 = powf(1.0 - fVar31 / fVar37,power);
          dVar34 = v_max_00;
          if (0.0 <= v_max_00) {
            dVar34 = 0.0;
          }
          dVar34 = (double)fVar37 * (dVar36 - dVar34) + dVar34;
        }
        else {
LAB_00182db9:
          dVar34 = (double)fVar31 * (v_max_00 - dVar34) + dVar34;
        }
        dVar34 = RoundScalarWithFormat<double,double>(format,IVar19,dVar34);
        IVar5 = (ImU32)format;
        if ((*v == dVar34) && (!NAN(*v) && !NAN(dVar34))) goto LAB_00182df1;
        *(double *)v = dVar34;
        bVar26 = true;
        goto LAB_00182e0b;
      }
      ClearActiveID();
LAB_00182309:
      bVar26 = false;
    }
    else {
      bVar26 = false;
    }
LAB_00182e12:
    fVar37 = SliderBehaviorCalcRatioFromValue<double,double>(IVar5,*v,dVar36,v_max_00,power,fVar37);
    if (uVar25 != 0) {
      fVar37 = 1.0 - fVar37;
    }
    fVar40 = (((fVar39 + -2.0) - fVar41) - fVar40) * fVar37 + fVar40;
    if (uVar25 != 0) {
      local_50.x = (bb->Min).x + 2.0;
      local_48.x = (bb->Max).x + -2.0;
      local_50.y = -fVar38 * 0.5 + fVar40;
      local_48.y = fVar38 * 0.5 + fVar40;
    }
    else {
      local_50.x = -fVar38 * 0.5 + fVar40;
      local_48.x = fVar38 * 0.5 + fVar40;
      local_50.y = (bb->Min).y + 2.0;
      local_48.y = (bb->Max).y + -2.0;
    }
    this = pIVar17->DrawList;
  }
  IVar5 = GetColorU32((pIVar2->ActiveId == id) + 0x13,1.0);
  fVar37 = (pIVar2->Style).GrabRounding;
LAB_00182f38:
  ImDrawList::AddRectFilled(this,&local_50,&local_48,IVar5,fVar37,0xf);
  return bVar26;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    switch (data_type)
    {
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)v_min >= IM_S32_MIN/2 && *(const ImS32*)v_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)v,  *(const ImS32*)v_min,  *(const ImS32*)v_max,  format, power, flags);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)v_min <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)v,  *(const ImU32*)v_min,  *(const ImU32*)v_max,  format, power, flags);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)v_min >= IM_S64_MIN/2 && *(const ImS64*)v_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)v,  *(const ImS64*)v_min,  *(const ImS64*)v_max,  format, power, flags);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)v_min <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)v,  *(const ImU64*)v_min,  *(const ImU64*)v_max,  format, power, flags);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)v_min >= -FLT_MAX/2.0f && *(const float*)v_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)v,  *(const float*)v_min,  *(const float*)v_max,  format, power, flags);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)v_min >= -DBL_MAX/2.0f && *(const double*)v_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)v, *(const double*)v_min, *(const double*)v_max, format, power, flags);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}